

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

int nsvg__parseStrokeDashArray(NSVGparser *p,char *str,float *strokeDashArray)

{
  char *pcVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  NSVGcoordinate c;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  char item [64];
  char local_78 [72];
  
  uVar2 = 0;
  if (*str != 'n') {
    uVar7 = 0;
    if (*str != '\0') {
      uVar7 = 0;
      do {
        local_78[0] = '\0';
        cVar6 = *str;
        while (cVar6 != '\0') {
          pvVar3 = memchr(" \t\n\v\f\r",(int)cVar6,7);
          if ((cVar6 != ',') && (pvVar3 == (void *)0x0)) break;
          pcVar1 = str + 1;
          str = str + 1;
          cVar6 = *pcVar1;
        }
        cVar6 = *str;
        if (cVar6 == '\0') {
          lVar4 = 0;
        }
        else {
          iVar8 = 0;
          do {
            pvVar3 = memchr(" \t\n\v\f\r",(int)cVar6,7);
            if ((cVar6 == ',') || (pvVar3 != (void *)0x0)) break;
            if (iVar8 < 0x3f) {
              lVar4 = (long)iVar8;
              iVar8 = iVar8 + 1;
              local_78[lVar4] = cVar6;
            }
            cVar6 = str[1];
            str = str + 1;
          } while (cVar6 != '\0');
          lVar4 = (long)iVar8;
        }
        local_78[lVar4] = '\0';
        if (local_78[0] == '\0') break;
        if ((int)uVar7 < 8) {
          fVar9 = p->viewWidth * p->viewWidth + p->viewHeight * p->viewHeight;
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            fVar9 = SQRT(fVar9);
          }
          c = nsvg__parseCoordinateRaw(local_78);
          fVar9 = nsvg__convertToPixels(p,c,0.0,fVar9 / 1.4142135);
          lVar4 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          strokeDashArray[lVar4] = ABS(fVar9);
        }
      } while (*str != '\0');
    }
    uVar2 = 0;
    if (0 < (int)uVar7) {
      fVar9 = 0.0;
      uVar5 = 0;
      do {
        fVar9 = fVar9 + strokeDashArray[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      uVar2 = 0;
      if (1e-06 < fVar9) {
        uVar2 = uVar7;
      }
    }
  }
  return uVar2;
}

Assistant:

static int nsvg__parseStrokeDashArray(NSVGparser* p, const char* str, float* strokeDashArray)
{
	char item[64];
	int count = 0, i;
	float sum = 0.0f;

	// Handle "none"
	if (str[0] == 'n')
		return 0;

	// Parse dashes
	while (*str) {
		str = nsvg__getNextDashItem(str, item);
		if (!*item) break;
		if (count < NSVG_MAX_DASHES)
			strokeDashArray[count++] = fabsf(nsvg__parseCoordinate(p, item, 0.0f, nsvg__actualLength(p)));
	}

	for (i = 0; i < count; i++)
		sum += strokeDashArray[i];
	if (sum <= 1e-6f)
		count = 0;

	return count;
}